

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_4::drawGLES2(Functions *gl,Program *program,DrawPrimitiveOp *drawOp)

{
  BlendMode BVar1;
  glVertexAttribPointerFunc p_Var2;
  GLuint GVar3;
  GLES2Program *this;
  const_reference pvVar4;
  GLES2Program *gles2Program;
  DrawPrimitiveOp *drawOp_local;
  Program *program_local;
  Functions *gl_local;
  
  this = (GLES2Program *)
         __dynamic_cast(program,&egl::(anonymous_namespace)::Program::typeinfo,
                        &egl::(anonymous_namespace)::GLES2Program::typeinfo,0);
  if (this != (GLES2Program *)0x0) {
    BVar1 = drawOp->blend;
    if (BVar1 == BLENDMODE_NONE) {
      (*gl->disable)(0xbe2);
    }
    else if (BVar1 == BLENDMODE_ADDITIVE) {
      (*gl->enable)(0xbe2);
      (*gl->blendFunc)(1,1);
    }
    else if (BVar1 == BLENDMODE_SRC_OVER) {
      (*gl->enable)(0xbe2);
      (*gl->blendFunc)(0x302,0x303);
    }
    if (drawOp->depth == DEPTHMODE_NONE) {
      (*gl->disable)(0xb71);
    }
    else if (drawOp->depth == DEPTHMODE_LESS) {
      (*gl->enable)(0xb71);
    }
    if (drawOp->stencil == STENCILMODE_NONE) {
      (*gl->disable)(0xb90);
    }
    else if (drawOp->stencil == STENCILMODE_LEQUAL_INC) {
      (*gl->enable)(0xb90);
      (*gl->stencilFunc)(0x203,drawOp->stencilRef,0xffffffff);
      (*gl->stencilOp)(0x1e00,0x1e02,0x1e02);
    }
    (*gl->disable)(0xbd0);
    p_Var2 = gl->vertexAttribPointer;
    GVar3 = GLES2Program::getPositionLoc(this);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&drawOp->positions,0);
    (*p_Var2)(GVar3,4,0x1406,'\0',0,pvVar4);
    p_Var2 = gl->vertexAttribPointer;
    GVar3 = GLES2Program::getColorLoc(this);
    pvVar4 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       (&drawOp->colors,0);
    (*p_Var2)(GVar3,4,0x1406,'\0',0,pvVar4);
    (*gl->drawArrays)(4,0,drawOp->count * 3);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void drawGLES2 (const glw::Functions& gl, const Program& program, const DrawPrimitiveOp& drawOp)
{
	const GLES2Program& gles2Program = dynamic_cast<const GLES2Program&>(program);

	switch (drawOp.blend)
	{
		case BLENDMODE_NONE:
			gl.disable(GL_BLEND);
			break;

		case BLENDMODE_ADDITIVE:
			gl.enable(GL_BLEND);
			gl.blendFunc(GL_ONE, GL_ONE);
			break;

		case BLENDMODE_SRC_OVER:
			gl.enable(GL_BLEND);
			gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
			break;

		default:
			DE_ASSERT(false);
	}

	switch (drawOp.depth)
	{
		case DEPTHMODE_NONE:
			gl.disable(GL_DEPTH_TEST);
			break;

		case DEPTHMODE_LESS:
			gl.enable(GL_DEPTH_TEST);
			break;

		default:
			DE_ASSERT(false);
	}

	switch (drawOp.stencil)
	{
		case STENCILMODE_NONE:
			gl.disable(GL_STENCIL_TEST);
			break;

		case STENCILMODE_LEQUAL_INC:
			gl.enable(GL_STENCIL_TEST);
			gl.stencilFunc(GL_LEQUAL, drawOp.stencilRef, ~0u);
			gl.stencilOp(GL_KEEP, GL_INCR, GL_INCR);
			break;

		default:
			DE_ASSERT(false);
	}

	gl.disable(GL_DITHER);

	gl.vertexAttribPointer(gles2Program.getPositionLoc(), 4, GL_FLOAT, GL_FALSE, 0, &drawOp.positions[0]);
	gl.vertexAttribPointer(gles2Program.getColorLoc(), 4, GL_FLOAT, GL_FALSE, 0, &drawOp.colors[0]);

	DE_ASSERT(drawOp.type == PRIMITIVETYPE_TRIANGLE);
	gl.drawArrays(GL_TRIANGLES, 0, drawOp.count*3);
}